

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSToken.cpp
# Opt level: O1

void __thiscall OSToken::OSToken(OSToken *this,string *inTokenPath,int inUmask)

{
  _Rb_tree_header *p_Var1;
  int inUmask_00;
  pointer pcVar2;
  bool bVar3;
  Directory *this_00;
  long *plVar4;
  Generation *pGVar5;
  ObjectFile *this_01;
  MutexFactory *this_02;
  Mutex *pMVar6;
  size_type *psVar7;
  int __c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  undefined1 *local_100 [2];
  undefined1 local_f0 [16];
  string local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  string *local_b8;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  string local_90;
  string local_70;
  string local_50;
  
  (this->super_ObjectStoreToken)._vptr_ObjectStoreToken = (_func_int **)&PTR_setSOPIN_00151ce0;
  local_b8 = &this->tokenPath;
  local_c0 = &(this->tokenPath).field_2;
  (this->tokenPath)._M_dataplus._M_p = (pointer)local_c0;
  (this->tokenPath)._M_string_length = 0;
  (this->tokenPath).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->objects)._M_t._M_impl.super__Rb_tree_header;
  (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->objects)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->allObjects)._M_t._M_impl.super__Rb_tree_header;
  (this->allObjects)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->allObjects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->allObjects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->allObjects)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->allObjects)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->currentFiles)._M_t._M_impl.super__Rb_tree_header;
  (this->currentFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->currentFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->currentFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->currentFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->currentFiles)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::_M_assign((string *)local_b8);
  this->umask = inUmask;
  this_00 = (Directory *)operator_new(0x68);
  pcVar2 = (this->tokenPath)._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + (this->tokenPath)._M_string_length);
  Directory::Directory(this_00,&local_50);
  this->tokenDir = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pcVar2 = (this->tokenPath)._M_dataplus._M_p;
  local_100[0] = local_f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_100,pcVar2,pcVar2 + (this->tokenPath)._M_string_length);
  std::__cxx11::string::append((char *)local_100);
  plVar4 = (long *)std::__cxx11::string::append((char *)local_100);
  psVar7 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_70.field_2._M_allocated_capacity = *psVar7;
    local_70.field_2._8_8_ = plVar4[3];
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  }
  else {
    local_70.field_2._M_allocated_capacity = *psVar7;
    local_70._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_70._M_string_length = plVar4[1];
  *plVar4 = (long)psVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  pGVar5 = Generation::create(&local_70,this->umask,true);
  this->gen = pGVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_100[0] != local_f0) {
    operator_delete(local_100[0]);
  }
  this_01 = (ObjectFile *)operator_new(0xb0);
  pcVar2 = (this->tokenPath)._M_dataplus._M_p;
  local_100[0] = local_f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_100,pcVar2,pcVar2 + (this->tokenPath)._M_string_length);
  std::__cxx11::string::append((char *)local_100);
  plVar4 = (long *)std::__cxx11::string::append((char *)local_100);
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  psVar7 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_e0.field_2._M_allocated_capacity = *psVar7;
    local_e0.field_2._8_4_ = (undefined4)plVar4[3];
    local_e0.field_2._12_4_ = *(undefined4 *)((long)plVar4 + 0x1c);
  }
  else {
    local_e0.field_2._M_allocated_capacity = *psVar7;
    local_e0._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_e0._M_string_length = plVar4[1];
  *plVar4 = (long)psVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  inUmask_00 = this->umask;
  pcVar2 = (this->tokenPath)._M_dataplus._M_p;
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b0,pcVar2,pcVar2 + (this->tokenPath)._M_string_length);
  std::__cxx11::string::append((char *)local_b0);
  plVar4 = (long *)std::__cxx11::string::append((char *)local_b0);
  psVar7 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_90.field_2._M_allocated_capacity = *psVar7;
    local_90.field_2._8_8_ = plVar4[3];
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar7;
    local_90._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_90._M_string_length = plVar4[1];
  *plVar4 = (long)psVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  ObjectFile::ObjectFile(this_01,this,&local_e0,inUmask_00,&local_90,false);
  this->tokenObject = this_01;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  if (local_100[0] != local_f0) {
    operator_delete(local_100[0]);
  }
  this_02 = MutexFactory::i();
  pMVar6 = MutexFactory::getMutex(this_02);
  this->tokenMutex = pMVar6;
  bVar3 = false;
  if ((pMVar6 != (Mutex *)0x0) && (this->gen != (Generation *)0x0)) {
    bVar3 = Directory::isValid(this->tokenDir);
    if (bVar3) {
      bVar3 = this->tokenObject->valid;
    }
    else {
      bVar3 = false;
    }
  }
  this->valid = bVar3;
  softHSMLog(7,"OSToken",
             "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
             ,0x41,"Opened token %s",(this->tokenPath)._M_dataplus._M_p);
  index(this,(char *)0x1,__c);
  return;
}

Assistant:

OSToken::OSToken(const std::string inTokenPath, int inUmask)
{
	tokenPath = inTokenPath;
	umask = inUmask;

	tokenDir = new Directory(tokenPath);
	gen = Generation::create(tokenPath + OS_PATHSEP + "generation", umask, true);
	tokenObject = new ObjectFile(this, tokenPath + OS_PATHSEP + "token.object", umask, tokenPath + OS_PATHSEP + "token.lock");
	tokenMutex = MutexFactory::i()->getMutex();
	valid = (gen != NULL) && (tokenMutex != NULL) && tokenDir->isValid() && tokenObject->valid;

	DEBUG_MSG("Opened token %s", tokenPath.c_str());

	index(true);
}